

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManInvertConstraints(Gia_Man_t *pAig)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  
  if (pAig->nConstrs != 0) {
    pVVar7 = pAig->vCos;
    uVar6 = pVVar7->nSize;
    uVar8 = (ulong)uVar6;
    uVar4 = uVar6 - pAig->nRegs;
    uVar5 = (ulong)uVar4;
    if (uVar4 != 0 && pAig->nRegs <= (int)uVar6) {
      lVar3 = 0;
      do {
        if ((int)uVar8 <= lVar3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar7->pArray[lVar3];
        if (((long)iVar2 < 0) || (pAig->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pAig->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        if ((long)(int)uVar5 - (long)pAig->nConstrs <= lVar3) {
          pGVar1 = pAig->pObjs + iVar2;
          uVar5 = *(ulong *)pGVar1;
          uVar6 = (uint)uVar5;
          if ((-1 < (int)uVar6) || ((uVar6 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x219,"void Gia_ObjFlipFaninC0(Gia_Obj_t *)");
          }
          *(ulong *)pGVar1 = uVar5 ^ 0x20000000;
        }
        lVar3 = lVar3 + 1;
        pVVar7 = pAig->vCos;
        uVar8 = (ulong)pVVar7->nSize;
        uVar5 = uVar8 - (long)pAig->nRegs;
      } while (lVar3 < (long)uVar5);
    }
  }
  return;
}

Assistant:

void Gia_ManInvertConstraints( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i;
    if ( Gia_ManConstrNum(pAig) == 0 )
        return;
    Gia_ManForEachPo( pAig, pObj, i )
        if ( i >= Gia_ManPoNum(pAig) - Gia_ManConstrNum(pAig) )
            Gia_ObjFlipFaninC0( pObj );
}